

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall
embree::HeightField::HeightField(HeightField *this,Ref<embree::Image> *texture,BBox3fa *bounds)

{
  Image *pIVar1;
  undefined8 uVar2;
  
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__HeightField_001c4dd8;
  pIVar1 = texture->ptr;
  (this->texture).ptr = pIVar1;
  if (pIVar1 != (Image *)0x0) {
    (*(pIVar1->super_RefCount)._vptr_RefCount[2])();
  }
  uVar2 = *(undefined8 *)((long)&(bounds->lower).field_0 + 8);
  *(undefined8 *)&(this->bounds).lower.field_0 = *(undefined8 *)&(bounds->lower).field_0;
  *(undefined8 *)((long)&(this->bounds).lower.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&(bounds->upper).field_0 + 8);
  *(undefined8 *)&(this->bounds).upper.field_0 = *(undefined8 *)&(bounds->upper).field_0;
  *(undefined8 *)((long)&(this->bounds).upper.field_0 + 8) = uVar2;
  return;
}

Assistant:

HeightField (Ref<Image> texture, const BBox3fa& bounds)
      : texture(texture), bounds(bounds) {}